

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Database.cpp
# Opt level: O1

void __thiscall
Database::addUser(Database *this,string *userName,string *alias,string *bio,string *password)

{
  int iVar1;
  long *plVar2;
  DatabaseException *this_00;
  long *plVar3;
  size_type *psVar4;
  char *errorMsg;
  string error;
  string query;
  char *local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  long *local_130;
  long local_128;
  long local_120;
  long lStack_118;
  long *local_110;
  long local_108;
  long local_100;
  long lStack_f8;
  long *local_f0;
  long local_e8;
  long local_e0;
  long lStack_d8;
  long *local_d0;
  long local_c8;
  long local_c0;
  long lStack_b8;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_158 = (char *)0x0;
  std::operator+(&local_50,"insert into users (username, alias, bio, password) values (\'",userName)
  ;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_50);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_e0 = *plVar3;
    lStack_d8 = plVar2[3];
    local_f0 = &local_e0;
  }
  else {
    local_e0 = *plVar3;
    local_f0 = (long *)*plVar2;
  }
  local_e8 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_f0,(ulong)(alias->_M_dataplus)._M_p);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_c0 = *plVar3;
    lStack_b8 = plVar2[3];
    local_d0 = &local_c0;
  }
  else {
    local_c0 = *plVar3;
    local_d0 = (long *)*plVar2;
  }
  local_c8 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_d0);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_a0 = *plVar3;
    lStack_98 = plVar2[3];
    local_b0 = &local_a0;
  }
  else {
    local_a0 = *plVar3;
    local_b0 = (long *)*plVar2;
  }
  local_a8 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::_M_append((char *)&local_b0,(ulong)(bio->_M_dataplus)._M_p)
  ;
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_80 = *plVar3;
    lStack_78 = plVar2[3];
    local_90 = &local_80;
  }
  else {
    local_80 = *plVar3;
    local_90 = (long *)*plVar2;
  }
  local_88 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_90);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_120 = *plVar3;
    lStack_118 = plVar2[3];
    local_130 = &local_120;
  }
  else {
    local_120 = *plVar3;
    local_130 = (long *)*plVar2;
  }
  local_128 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_130,(ulong)(password->_M_dataplus)._M_p);
  local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
  psVar4 = (size_type *)(plVar2 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar2 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar4) {
    local_150.field_2._M_allocated_capacity = *psVar4;
    local_150.field_2._8_8_ = plVar2[3];
  }
  else {
    local_150.field_2._M_allocated_capacity = *psVar4;
    local_150._M_dataplus._M_p = (pointer)*plVar2;
  }
  local_150._M_string_length = plVar2[1];
  *plVar2 = (long)psVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_150);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_100 = *plVar3;
    lStack_f8 = plVar2[3];
    local_110 = &local_100;
  }
  else {
    local_100 = *plVar3;
    local_110 = (long *)*plVar2;
  }
  local_108 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != &local_150.field_2) {
    operator_delete(local_150._M_dataplus._M_p);
  }
  if (local_130 != &local_120) {
    operator_delete(local_130);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90);
  }
  if (local_b0 != &local_a0) {
    operator_delete(local_b0);
  }
  if (local_d0 != &local_c0) {
    operator_delete(local_d0);
  }
  if (local_f0 != &local_e0) {
    operator_delete(local_f0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  iVar1 = sqlite3_exec(this->database,(char *)local_110,(sqlite3_callback)0x0,(void *)0x0,&local_158
                      );
  if (iVar1 == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"User added successfully",0x17);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x18');
    std::ostream::put('\x18');
    std::ostream::flush();
    if (local_110 != &local_100) {
      operator_delete(local_110);
    }
    return;
  }
  std::__cxx11::string::string((string *)&local_150,local_158,(allocator *)&local_130);
  sqlite3_free(local_158);
  this_00 = (DatabaseException *)__cxa_allocate_exception(0x28);
  std::operator+(&local_70,"Error while adding user: ",&local_150);
  DatabaseException::DatabaseException(this_00,&local_70);
  __cxa_throw(this_00,&DatabaseException::typeinfo,DatabaseException::~DatabaseException);
}

Assistant:

void Database::addUser(std::string userName, std::string alias, std::string bio, std::string password)
{
	char* errorMsg = nullptr;
	std::string query = "insert into users (username, alias, bio, password) values ('" +
						userName + "','" + alias + "','" + bio + "','" + password + "');";

	int failure = sqlite3_exec(database, query.c_str(), nullptr, nullptr, &errorMsg);

	if(failure)
	{
		std::string error(errorMsg);
		sqlite3_free(errorMsg);
		throw DatabaseException("Error while adding user: " + error);
	}
	else
	{
		std::cout << "User added successfully" << std::endl;
	}
}